

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btBvhTriangleMeshShape::setOptimizedBvh
          (btBvhTriangleMeshShape *this,btOptimizedBvh *bvh,btVector3 *scaling)

{
  _func_int **in_RSI;
  btTriangleMeshShape *in_RDI;
  btScalar bVar1;
  btVector3 *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd8 [16];
  
  in_RDI[1].super_btConcaveShape.super_btCollisionShape._vptr_btCollisionShape = in_RSI;
  *(undefined1 *)((long)&in_RDI[1].super_btConcaveShape.super_btCollisionShape.m_userPointer + 1) =
       0;
  (*(in_RDI->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[7])();
  operator-(in_stack_ffffffffffffffd8._8_8_,in_stack_ffffffffffffffd8._0_8_);
  bVar1 = btVector3::length2((btVector3 *)0x1a93c6);
  if (1.1920929e-07 < bVar1) {
    btTriangleMeshShape::setLocalScaling(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void   btBvhTriangleMeshShape::setOptimizedBvh(btOptimizedBvh* bvh, const btVector3& scaling)
{
   btAssert(!m_bvh);
   btAssert(!m_ownsBvh);

   m_bvh = bvh;
   m_ownsBvh = false;
   // update the scaling without rebuilding the bvh
   if ((getLocalScaling() -scaling).length2() > SIMD_EPSILON)
   {
      btTriangleMeshShape::setLocalScaling(scaling);
   }
}